

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  BYTE *pBVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  ZSTD_matchState_t *pZVar10;
  BYTE *pBVar11;
  ulong *mEnd;
  U32 *pUVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  U32 *pUVar15;
  bool bVar16;
  uint uVar17;
  undefined8 uVar18;
  char cVar19;
  char cVar20;
  ulong *puVar21;
  ulong *puVar22;
  size_t sVar23;
  int *piVar24;
  seqDef *psVar25;
  byte bVar26;
  byte bVar28;
  byte bVar29;
  U32 UVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  ulong *puVar36;
  uint uVar37;
  ulong *puVar38;
  long lVar39;
  uint uVar40;
  size_t _size;
  uint uVar41;
  BYTE *litEnd;
  ulong *puVar42;
  BYTE *pBVar43;
  int *piVar44;
  ulong *puVar45;
  ulong uVar46;
  ulong *puVar47;
  ulong *puVar48;
  ulong uVar49;
  int iVar50;
  int *iStart;
  ulong uVar51;
  char *_ptr;
  uint uVar52;
  BYTE *pBVar53;
  BYTE *litEnd_3;
  U32 UVar54;
  BYTE *litEnd_1;
  uint uVar55;
  ulong uVar57;
  int *piVar58;
  BYTE *pBVar59;
  uint uVar60;
  BYTE *base;
  BYTE *istart;
  BYTE *iend;
  BYTE *litLimit_w_1;
  U32 prefixLowestIndex;
  BYTE *prefixLowest;
  BYTE *ilimit;
  BYTE *dictEnd;
  BYTE *dictBase;
  U32 dictIndexDelta;
  BYTE *dictStart;
  U32 *hashLong;
  BYTE *litLimit_w;
  U32 dictStartIndex;
  U32 *hashSmall;
  uint local_144;
  BYTE *local_130;
  uint local_11c;
  byte bVar27;
  ulong uVar56;
  
  pBVar9 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  iVar50 = (int)pBVar9;
  uVar40 = (int)iEnd - iVar50;
  pBVar59 = (BYTE *)(ulong)uVar40;
  uVar41 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar37 = (ms->window).dictLimit;
  uVar17 = uVar40 - uVar41;
  if (uVar40 - uVar37 <= uVar41) {
    uVar17 = uVar37;
  }
  if (ms->loadedDictEnd != 0) {
    uVar17 = uVar37;
  }
  pZVar10 = ms->dictMatchState;
  uVar6 = (pZVar10->window).dictLimit;
  pBVar11 = (pZVar10->window).base;
  piVar44 = (int *)(pBVar11 + uVar6);
  iStart = (int *)(pBVar9 + uVar17);
  uVar41 = uVar41 + uVar37;
  puVar21 = (ulong *)((long)src + (srcSize - 8));
  mEnd = (ulong *)(pZVar10->window).nextSrc;
  uVar55 = ((int)pBVar11 - (int)mEnd) + uVar17;
  uVar56 = (ulong)uVar55;
  pUVar12 = pZVar10->hashTable;
  pUVar13 = pZVar10->chainTable;
  uVar31 = (pZVar10->cParams).hashLog;
  uVar60 = (pZVar10->cParams).chainLog;
  uVar52 = ((int)src - ((int)piVar44 + (int)iStart)) + (int)mEnd;
  uVar34 = (ms->cParams).minMatch;
  pUVar14 = ms->hashTable;
  uVar7 = (ms->cParams).hashLog;
  pUVar15 = ms->chainTable;
  uVar8 = (ms->cParams).chainLog;
  local_144 = *rep;
  local_11c = rep[1];
  uVar37 = uVar31 + 8;
  uVar33 = uVar60 + 8;
  pBVar53 = (BYTE *)(ulong)uVar33;
  bVar26 = (byte)uVar31;
  bVar27 = (byte)uVar60;
  cVar19 = (char)uVar7;
  cVar20 = (char)uVar8;
  if (uVar34 == 5) {
    if (uVar41 < uVar40) goto LAB_001cd676;
    if (ms->prefetchCDictTables != 0) {
      if (uVar31 < 0x3e) {
        uVar35 = 0;
        do {
          uVar35 = uVar35 + 0x40;
        } while (uVar35 < (ulong)(4L << (bVar26 & 0x3f)));
      }
      if (uVar60 < 0x3e) {
        uVar35 = 0;
        do {
          uVar35 = uVar35 + 0x40;
        } while (uVar35 < (ulong)(4L << (bVar27 & 0x3f)));
      }
    }
    if (uVar52 < local_144) goto LAB_001cd695;
    puVar42 = (ulong *)((long)src + (ulong)(uVar52 == 0));
    if (uVar52 < local_11c) goto LAB_001cd6b4;
    if (puVar21 <= puVar42) goto LAB_001cd4f2;
    if ((((0x20 < uVar7) || (0x20 < uVar8)) || (0x20 < uVar37)) || (0x20 < uVar33))
    goto LAB_001cd657;
    bVar28 = 0x40 - cVar19;
    bVar29 = 0x40 - cVar20;
    puVar1 = (ulong *)((long)iEnd + -7);
    puVar2 = (ulong *)((long)iEnd + -3);
    puVar3 = (ulong *)((long)iEnd + -1);
    puVar22 = iEnd + -4;
    uVar37 = 0xbb000000;
LAB_001cb70d:
    uVar35 = *puVar42;
    uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
    uVar51 = uVar35 * -0x30e4432345000000 >> (bVar29 & 0x3f);
    uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
    uVar57 = uVar35 * -0x30e4432345000000 >> (0x38 - bVar27 & 0x3f);
    uVar40 = pUVar12[uVar46 >> 8];
    uVar41 = pUVar13[uVar57 >> 8];
    UVar54 = (int)puVar42 - iVar50;
    uVar33 = pUVar14[uVar49];
    UVar30 = UVar54 + 1;
    uVar31 = UVar30 - local_144;
    piVar58 = (int *)(pBVar9 + uVar31);
    if (uVar31 < uVar17) {
      piVar58 = (int *)(pBVar11 + (uVar31 - uVar55));
    }
    uVar60 = pUVar15[uVar51];
    pUVar15[uVar51] = UVar54;
    pUVar14[uVar49] = UVar54;
    if ((2 < (uVar17 - 1) - uVar31) && (*piVar58 == *(int *)((long)puVar42 + 1))) {
      puVar38 = iEnd;
      if (uVar31 < uVar17) {
        puVar38 = mEnd;
      }
      sVar23 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar42 + 5),(BYTE *)(piVar58 + 1),(BYTE *)iEnd,
                          (BYTE *)puVar38,(BYTE *)iStart);
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          puVar42 = (ulong *)((long)puVar42 + 1);
          uVar35 = (long)puVar42 - (long)src;
          puVar38 = (ulong *)seqStore->lit;
          if ((BYTE *)((long)puVar38 + uVar35) <= seqStore->litStart + seqStore->maxNbLit) {
            if (puVar42 <= iEnd) {
              if (puVar22 < puVar42) {
                ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
              }
              else {
                uVar46 = *(ulong *)((long)src + 8);
                *puVar38 = *src;
                puVar38[1] = uVar46;
                if (0x10 < uVar35) {
                  pBVar59 = seqStore->lit;
                  if (0xffffffffffffffe0 <
                      (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10))))
                  goto LAB_001cd619;
                  uVar46 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar59 + 0x18) = uVar46;
                  if (0x20 < (long)uVar35) {
                    lVar39 = 0;
                    do {
                      puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
                      uVar18 = puVar5[1];
                      pBVar53 = pBVar59 + lVar39 + 0x20;
                      *(undefined8 *)pBVar53 = *puVar5;
                      *(undefined8 *)(pBVar53 + 8) = uVar18;
                      puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
                      uVar18 = puVar5[1];
                      *(undefined8 *)(pBVar53 + 0x10) = *puVar5;
                      *(undefined8 *)(pBVar53 + 0x18) = uVar18;
                      lVar39 = lVar39 + 0x20;
                    } while (pBVar53 + 0x20 < pBVar59 + uVar35);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar35;
              if (0xffff < uVar35) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5fa;
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              pBVar53 = (BYTE *)(sVar23 + 4);
              psVar25 = seqStore->sequences;
              psVar25->litLength = (U16)uVar35;
              psVar25->offBase = 1;
              if (pBVar53 < (BYTE *)0x3) goto LAB_001cd540;
              pBVar59 = (BYTE *)(sVar23 + 1);
              if (pBVar59 < (BYTE *)0x10000) goto LAB_001cc287;
              if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001cc261;
              goto LAB_001cd5bc;
            }
            goto LAB_001cd59d;
          }
          goto LAB_001cd57e;
        }
        goto LAB_001cd55f;
      }
      goto LAB_001cd521;
    }
    puVar38 = puVar42;
    if (uVar33 <= uVar17) {
      if ((char)uVar46 != (char)uVar40) goto LAB_001cba55;
      uVar40 = uVar40 >> 8;
      puVar38 = (ulong *)(pBVar11 + uVar40);
      if (puVar38 < mEnd) {
        iVar32 = 0;
        if ((uVar6 < uVar40) && (*puVar38 == uVar35)) {
          sVar23 = ZSTD_count_2segments
                             ((BYTE *)(puVar42 + 1),(BYTE *)(puVar38 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                              (BYTE *)iStart);
          pBVar53 = (BYTE *)(sVar23 + 8);
          uVar37 = UVar54 - (uVar40 + uVar55);
          iVar32 = 0xd;
          if (src < puVar42) {
            piVar58 = (int *)(pBVar11 + ((ulong)uVar40 - 1));
            do {
              puVar38 = (ulong *)((long)puVar42 + -1);
              if ((*(BYTE *)puVar38 != (BYTE)*piVar58) ||
                 (pBVar53 = pBVar53 + 1, puVar42 = puVar38, puVar38 <= src)) break;
              bVar16 = piVar44 < piVar58;
              piVar58 = (int *)((long)piVar58 + -1);
            } while (bVar16);
          }
        }
        if (iVar32 == 0xd) goto LAB_001cc10f;
        puVar38 = puVar42;
        if (iVar32 == 0) goto LAB_001cba55;
        goto LAB_001cc4ec;
      }
      goto LAB_001cd638;
    }
    puVar36 = (ulong *)(pBVar9 + uVar33);
    if (*puVar36 == uVar35) {
      puVar38 = puVar42 + 1;
      puVar47 = puVar36 + 1;
      puVar45 = puVar38;
      if (puVar38 < puVar1) {
        uVar46 = *puVar38 ^ *puVar47;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar47 == *puVar38) {
          puVar45 = puVar42 + 2;
          puVar47 = puVar36 + 2;
          do {
            if (puVar1 <= puVar45) goto LAB_001cbcad;
            uVar35 = *puVar47;
            uVar46 = *puVar45;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar45 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar38));
            puVar45 = puVar45 + 1;
            puVar47 = puVar47 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_001cbcad:
        if ((puVar45 < puVar2) && ((int)*puVar47 == (int)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 4);
          puVar47 = (ulong *)((long)puVar47 + 4);
        }
        if ((puVar45 < puVar3) && ((short)*puVar47 == (short)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 2);
          puVar47 = (ulong *)((long)puVar47 + 2);
        }
        if (puVar45 < iEnd) {
          puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar47 == (BYTE)*puVar45));
        }
        pBVar53 = (BYTE *)((long)puVar45 - (long)puVar38);
      }
      pBVar53 = pBVar53 + 8;
      uVar37 = (int)puVar42 - (int)puVar36;
      if (src < puVar42) {
        piVar58 = (int *)(pBVar9 + ((ulong)uVar33 - 1));
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          if ((BYTE)*puVar38 != (BYTE)*piVar58) {
            puVar42 = (ulong *)((long)puVar38 + 1);
            goto LAB_001cc10f;
          }
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) &&
                (bVar16 = iStart < piVar58, piVar58 = (int *)((long)piVar58 + -1), puVar38 = puVar42
                , bVar16));
        goto LAB_001cbd4b;
      }
      goto LAB_001cc10f;
    }
LAB_001cba55:
    if (uVar60 <= uVar17) {
      if ((char)uVar57 == (char)uVar41) {
        uVar41 = uVar41 >> 8;
        if ((uVar6 < uVar41) && (*(int *)(pBVar11 + uVar41) == (int)*puVar38)) {
          uVar60 = uVar41 + uVar55;
          piVar58 = (int *)(pBVar11 + uVar41);
          goto LAB_001cba70;
        }
      }
LAB_001cbbb3:
      puVar42 = (ulong *)((long)puVar38 + ((long)puVar38 - (long)src >> 8) + 1);
      goto LAB_001cc4ec;
    }
    piVar58 = (int *)(pBVar9 + uVar60);
    if (*piVar58 != (int)*puVar38) goto LAB_001cbbb3;
LAB_001cba70:
    uVar35 = *(ulong *)((long)puVar38 + 1);
    uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
    uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
    puVar36 = (ulong *)((long)puVar38 + 1);
    uVar40 = pUVar14[uVar49];
    uVar41 = pUVar12[uVar46 >> 8];
    pUVar14[uVar49] = UVar30;
    puVar42 = puVar38;
    if (uVar17 < uVar40) {
      puVar45 = (ulong *)(pBVar9 + uVar40);
      if (*puVar45 != uVar35) goto LAB_001cbd5d;
      puVar42 = (ulong *)((long)puVar38 + 9);
      puVar48 = puVar45 + 1;
      puVar47 = puVar42;
      if (puVar42 < puVar1) {
        uVar46 = *puVar42 ^ *puVar48;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar48 == *puVar42) {
          puVar47 = (ulong *)((long)puVar38 + 0x11);
          puVar48 = puVar45 + 2;
          do {
            if (puVar1 <= puVar47) goto LAB_001cbf96;
            uVar35 = *puVar48;
            uVar46 = *puVar47;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar47 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar42));
            puVar47 = puVar47 + 1;
            puVar48 = puVar48 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_001cbf96:
        if ((puVar47 < puVar2) && ((int)*puVar48 == (int)*puVar47)) {
          puVar47 = (ulong *)((long)puVar47 + 4);
          puVar48 = (ulong *)((long)puVar48 + 4);
        }
        if ((puVar47 < puVar3) && ((short)*puVar48 == (short)*puVar47)) {
          puVar47 = (ulong *)((long)puVar47 + 2);
          puVar48 = (ulong *)((long)puVar48 + 2);
        }
        if (puVar47 < iEnd) {
          puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar48 == (BYTE)*puVar47));
        }
        pBVar53 = (BYTE *)((long)puVar47 - (long)puVar42);
      }
      pBVar53 = pBVar53 + 8;
      uVar37 = (int)puVar36 - (int)puVar45;
      iVar32 = 0xd;
      puVar42 = puVar36;
      if (src < puVar36) {
        piVar24 = (int *)(pBVar9 + ((ulong)uVar40 - 1));
        do {
          puVar42 = puVar38;
          if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_001cc0ea;
          pBVar53 = pBVar53 + 1;
        } while ((src < puVar42) &&
                (bVar16 = iStart < piVar24, piVar24 = (int *)((long)piVar24 + -1),
                puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
      }
    }
    else {
      iVar32 = 0;
      if ((char)uVar46 == (char)uVar41) {
        uVar41 = uVar41 >> 8;
        puVar45 = (ulong *)(pBVar11 + uVar41);
        if (puVar45 < mEnd) {
          if ((uVar6 < uVar41) && (*puVar45 == uVar35)) {
            sVar23 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar38 + 9),(BYTE *)(puVar45 + 1),(BYTE *)iEnd,
                                (BYTE *)mEnd,(BYTE *)iStart);
            pBVar53 = (BYTE *)(sVar23 + 8);
            uVar37 = UVar30 - (uVar55 + uVar41);
            iVar32 = 0xd;
            puVar42 = puVar36;
            if (src < puVar36) {
              piVar24 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
              do {
                puVar42 = puVar38;
                if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_001cc0ea;
                pBVar53 = pBVar53 + 1;
              } while ((src < puVar42) &&
                      (bVar16 = piVar44 < piVar24, piVar24 = (int *)((long)piVar24 + -1),
                      puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
            }
          }
          goto LAB_001cbd69;
        }
        goto LAB_001cd6d3;
      }
LAB_001cbd5d:
      iVar32 = 0;
    }
    goto LAB_001cbd69;
  }
  if (uVar34 == 6) {
    if (uVar41 < uVar40) goto LAB_001cd676;
    if (ms->prefetchCDictTables != 0) {
      if (uVar31 < 0x3e) {
        uVar35 = 0;
        do {
          uVar35 = uVar35 + 0x40;
        } while (uVar35 < (ulong)(4L << (bVar26 & 0x3f)));
      }
      if (uVar60 < 0x3e) {
        uVar35 = 0;
        do {
          uVar35 = uVar35 + 0x40;
        } while (uVar35 < (ulong)(4L << (bVar27 & 0x3f)));
      }
    }
    if (uVar52 < local_144) goto LAB_001cd695;
    puVar42 = (ulong *)((long)src + (ulong)(uVar52 == 0));
    if (uVar52 < local_11c) goto LAB_001cd6b4;
    if (puVar21 <= puVar42) goto LAB_001cd4f2;
    if ((((0x20 < uVar7) || (0x20 < uVar8)) || (0x20 < uVar37)) || (0x20 < uVar33))
    goto LAB_001cd657;
    bVar28 = 0x40 - cVar19;
    bVar29 = 0x40 - cVar20;
    puVar1 = (ulong *)((long)iEnd + -7);
    puVar2 = (ulong *)((long)iEnd + -3);
    puVar3 = (ulong *)((long)iEnd + -1);
    puVar22 = iEnd + -4;
    uVar37 = 0xbf9b0000;
LAB_001ca77c:
    uVar35 = *puVar42;
    uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
    uVar51 = uVar35 * -0x30e4432340650000 >> (bVar29 & 0x3f);
    uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
    uVar57 = uVar35 * -0x30e4432340650000 >> (0x38 - bVar27 & 0x3f);
    uVar40 = pUVar12[uVar46 >> 8];
    uVar41 = pUVar13[uVar57 >> 8];
    UVar54 = (int)puVar42 - iVar50;
    uVar33 = pUVar14[uVar49];
    UVar30 = UVar54 + 1;
    uVar31 = UVar30 - local_144;
    piVar58 = (int *)(pBVar9 + uVar31);
    if (uVar31 < uVar17) {
      piVar58 = (int *)(pBVar11 + (uVar31 - uVar55));
    }
    uVar60 = pUVar15[uVar51];
    pUVar15[uVar51] = UVar54;
    pUVar14[uVar49] = UVar54;
    if ((2 < (uVar17 - 1) - uVar31) && (*piVar58 == *(int *)((long)puVar42 + 1))) {
      puVar38 = iEnd;
      if (uVar31 < uVar17) {
        puVar38 = mEnd;
      }
      sVar23 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar42 + 5),(BYTE *)(piVar58 + 1),(BYTE *)iEnd,
                          (BYTE *)puVar38,(BYTE *)iStart);
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          puVar42 = (ulong *)((long)puVar42 + 1);
          uVar35 = (long)puVar42 - (long)src;
          puVar38 = (ulong *)seqStore->lit;
          if ((BYTE *)((long)puVar38 + uVar35) <= seqStore->litStart + seqStore->maxNbLit) {
            if (puVar42 <= iEnd) {
              if (puVar22 < puVar42) {
                ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
              }
              else {
                uVar46 = *(ulong *)((long)src + 8);
                *puVar38 = *src;
                puVar38[1] = uVar46;
                if (0x10 < uVar35) {
                  pBVar59 = seqStore->lit;
                  if (0xffffffffffffffe0 <
                      (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10))))
                  goto LAB_001cd619;
                  uVar46 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar59 + 0x18) = uVar46;
                  if (0x20 < (long)uVar35) {
                    lVar39 = 0;
                    do {
                      puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
                      uVar18 = puVar5[1];
                      pBVar53 = pBVar59 + lVar39 + 0x20;
                      *(undefined8 *)pBVar53 = *puVar5;
                      *(undefined8 *)(pBVar53 + 8) = uVar18;
                      puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
                      uVar18 = puVar5[1];
                      *(undefined8 *)(pBVar53 + 0x10) = *puVar5;
                      *(undefined8 *)(pBVar53 + 0x18) = uVar18;
                      lVar39 = lVar39 + 0x20;
                    } while (pBVar53 + 0x20 < pBVar59 + uVar35);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar35;
              if (0xffff < uVar35) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5fa;
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              pBVar53 = (BYTE *)(sVar23 + 4);
              psVar25 = seqStore->sequences;
              psVar25->litLength = (U16)uVar35;
              psVar25->offBase = 1;
              if (pBVar53 < (BYTE *)0x3) goto LAB_001cd540;
              pBVar59 = (BYTE *)(sVar23 + 1);
              if (pBVar59 < (BYTE *)0x10000) goto LAB_001cb2f2;
              if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001cb2cc;
              goto LAB_001cd5bc;
            }
            goto LAB_001cd59d;
          }
          goto LAB_001cd57e;
        }
        goto LAB_001cd55f;
      }
      goto LAB_001cd521;
    }
    puVar38 = puVar42;
    if (uVar33 <= uVar17) {
      if ((char)uVar46 != (char)uVar40) goto LAB_001caaba;
      uVar40 = uVar40 >> 8;
      puVar38 = (ulong *)(pBVar11 + uVar40);
      if (puVar38 < mEnd) {
        iVar32 = 0;
        if ((uVar6 < uVar40) && (*puVar38 == uVar35)) {
          sVar23 = ZSTD_count_2segments
                             ((BYTE *)(puVar42 + 1),(BYTE *)(puVar38 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                              (BYTE *)iStart);
          pBVar53 = (BYTE *)(sVar23 + 8);
          uVar37 = UVar54 - (uVar40 + uVar55);
          iVar32 = 0xd;
          if (src < puVar42) {
            piVar58 = (int *)(pBVar11 + ((ulong)uVar40 - 1));
            do {
              puVar38 = (ulong *)((long)puVar42 + -1);
              if ((*(BYTE *)puVar38 != (BYTE)*piVar58) ||
                 (pBVar53 = pBVar53 + 1, puVar42 = puVar38, puVar38 <= src)) break;
              bVar16 = piVar44 < piVar58;
              piVar58 = (int *)((long)piVar58 + -1);
            } while (bVar16);
          }
        }
        if (iVar32 == 0xd) goto LAB_001cb173;
        puVar38 = puVar42;
        if (iVar32 == 0) goto LAB_001caaba;
        goto LAB_001cb54b;
      }
      goto LAB_001cd638;
    }
    puVar36 = (ulong *)(pBVar9 + uVar33);
    if (*puVar36 == uVar35) {
      puVar38 = puVar42 + 1;
      puVar47 = puVar36 + 1;
      puVar45 = puVar38;
      if (puVar38 < puVar1) {
        uVar46 = *puVar38 ^ *puVar47;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar47 == *puVar38) {
          puVar45 = puVar42 + 2;
          puVar47 = puVar36 + 2;
          do {
            if (puVar1 <= puVar45) goto LAB_001cad13;
            uVar35 = *puVar47;
            uVar46 = *puVar45;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar45 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar38));
            puVar45 = puVar45 + 1;
            puVar47 = puVar47 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_001cad13:
        if ((puVar45 < puVar2) && ((int)*puVar47 == (int)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 4);
          puVar47 = (ulong *)((long)puVar47 + 4);
        }
        if ((puVar45 < puVar3) && ((short)*puVar47 == (short)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 2);
          puVar47 = (ulong *)((long)puVar47 + 2);
        }
        if (puVar45 < iEnd) {
          puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar47 == (BYTE)*puVar45));
        }
        pBVar53 = (BYTE *)((long)puVar45 - (long)puVar38);
      }
      pBVar53 = pBVar53 + 8;
      uVar37 = (int)puVar42 - (int)puVar36;
      if (src < puVar42) {
        piVar58 = (int *)(pBVar9 + ((ulong)uVar33 - 1));
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          if ((BYTE)*puVar38 != (BYTE)*piVar58) {
            puVar42 = (ulong *)((long)puVar38 + 1);
            goto LAB_001cb173;
          }
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) &&
                (bVar16 = iStart < piVar58, piVar58 = (int *)((long)piVar58 + -1), puVar38 = puVar42
                , bVar16));
        goto LAB_001cadb7;
      }
      goto LAB_001cb173;
    }
LAB_001caaba:
    if (uVar60 <= uVar17) {
      if ((char)uVar57 == (char)uVar41) {
        uVar41 = uVar41 >> 8;
        if ((uVar6 < uVar41) && (*(int *)(pBVar11 + uVar41) == (int)*puVar38)) {
          uVar60 = uVar41 + uVar55;
          piVar58 = (int *)(pBVar11 + uVar41);
          goto LAB_001caad6;
        }
      }
LAB_001cac19:
      puVar42 = (ulong *)((long)puVar38 + ((long)puVar38 - (long)src >> 8) + 1);
      goto LAB_001cb54b;
    }
    piVar58 = (int *)(pBVar9 + uVar60);
    if (*piVar58 != (int)*puVar38) goto LAB_001cac19;
LAB_001caad6:
    uVar35 = *(ulong *)((long)puVar38 + 1);
    uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
    uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
    puVar36 = (ulong *)((long)puVar38 + 1);
    uVar40 = pUVar14[uVar49];
    uVar41 = pUVar12[uVar46 >> 8];
    pUVar14[uVar49] = UVar30;
    puVar42 = puVar38;
    if (uVar17 < uVar40) {
      puVar45 = (ulong *)(pBVar9 + uVar40);
      if (*puVar45 != uVar35) goto LAB_001cadc9;
      puVar42 = (ulong *)((long)puVar38 + 9);
      puVar48 = puVar45 + 1;
      puVar47 = puVar42;
      if (puVar42 < puVar1) {
        uVar46 = *puVar42 ^ *puVar48;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar48 == *puVar42) {
          puVar47 = (ulong *)((long)puVar38 + 0x11);
          puVar48 = puVar45 + 2;
          do {
            if (puVar1 <= puVar47) goto LAB_001caff8;
            uVar35 = *puVar48;
            uVar46 = *puVar47;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar47 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar42));
            puVar47 = puVar47 + 1;
            puVar48 = puVar48 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_001caff8:
        if ((puVar47 < puVar2) && ((int)*puVar48 == (int)*puVar47)) {
          puVar47 = (ulong *)((long)puVar47 + 4);
          puVar48 = (ulong *)((long)puVar48 + 4);
        }
        if ((puVar47 < puVar3) && ((short)*puVar48 == (short)*puVar47)) {
          puVar47 = (ulong *)((long)puVar47 + 2);
          puVar48 = (ulong *)((long)puVar48 + 2);
        }
        if (puVar47 < iEnd) {
          puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar48 == (BYTE)*puVar47));
        }
        pBVar53 = (BYTE *)((long)puVar47 - (long)puVar42);
      }
      pBVar53 = pBVar53 + 8;
      uVar37 = (int)puVar36 - (int)puVar45;
      iVar32 = 0xd;
      puVar42 = puVar36;
      if (src < puVar36) {
        piVar24 = (int *)(pBVar9 + ((ulong)uVar40 - 1));
        do {
          puVar42 = puVar38;
          if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_001cb14e;
          pBVar53 = pBVar53 + 1;
        } while ((src < puVar42) &&
                (bVar16 = iStart < piVar24, piVar24 = (int *)((long)piVar24 + -1),
                puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
      }
    }
    else {
      iVar32 = 0;
      if ((char)uVar46 == (char)uVar41) {
        uVar41 = uVar41 >> 8;
        puVar45 = (ulong *)(pBVar11 + uVar41);
        if (puVar45 < mEnd) {
          if ((uVar6 < uVar41) && (*puVar45 == uVar35)) {
            sVar23 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar38 + 9),(BYTE *)(puVar45 + 1),(BYTE *)iEnd,
                                (BYTE *)mEnd,(BYTE *)iStart);
            pBVar53 = (BYTE *)(sVar23 + 8);
            uVar37 = UVar30 - (uVar55 + uVar41);
            iVar32 = 0xd;
            puVar42 = puVar36;
            if (src < puVar36) {
              piVar24 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
              do {
                puVar42 = puVar38;
                if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_001cb14e;
                pBVar53 = pBVar53 + 1;
              } while ((src < puVar42) &&
                      (bVar16 = piVar44 < piVar24, piVar24 = (int *)((long)piVar24 + -1),
                      puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
            }
          }
          goto LAB_001cadd5;
        }
        goto LAB_001cd6d3;
      }
LAB_001cadc9:
      iVar32 = 0;
    }
    goto LAB_001cadd5;
  }
  if (uVar34 == 7) {
    if (uVar40 <= uVar41) {
      if (ms->prefetchCDictTables != 0) {
        if (uVar31 < 0x3e) {
          uVar35 = 0;
          do {
            uVar35 = uVar35 + 0x40;
          } while (uVar35 < (ulong)(4L << (bVar26 & 0x3f)));
        }
        if (uVar60 < 0x3e) {
          uVar35 = 0;
          do {
            uVar35 = uVar35 + 0x40;
          } while (uVar35 < (ulong)(4L << (bVar27 & 0x3f)));
        }
      }
      if (local_144 <= uVar52) {
        puVar42 = (ulong *)((long)src + (ulong)(uVar52 == 0));
        if (local_11c <= uVar52) {
          if (puVar42 < puVar21) {
            if ((((uVar7 < 0x21) && (uVar8 < 0x21)) && (uVar37 < 0x21)) && (uVar33 < 0x21)) {
              bVar28 = 0x40 - cVar19;
              bVar29 = 0x40 - cVar20;
              puVar1 = (ulong *)((long)iEnd - 7);
              puVar2 = (ulong *)((long)iEnd - 3);
              puVar3 = (ulong *)((long)iEnd - 1);
              puVar22 = iEnd + -4;
              uVar37 = 0xbfa56300;
LAB_001c97dc:
              uVar35 = *puVar42;
              uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
              uVar51 = uVar35 * -0x30e44323405a9d00 >> (bVar29 & 0x3f);
              uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
              uVar57 = uVar35 * -0x30e44323405a9d00 >> (0x38 - bVar27 & 0x3f);
              uVar40 = pUVar12[uVar46 >> 8];
              uVar41 = pUVar13[uVar57 >> 8];
              UVar54 = (int)puVar42 - iVar50;
              uVar33 = pUVar14[uVar49];
              UVar30 = UVar54 + 1;
              uVar31 = UVar30 - local_144;
              piVar58 = (int *)(pBVar9 + uVar31);
              if (uVar31 < uVar17) {
                piVar58 = (int *)(pBVar11 + (uVar31 - uVar55));
              }
              uVar60 = pUVar15[uVar51];
              pUVar15[uVar51] = UVar54;
              pUVar14[uVar49] = UVar54;
              if (((uVar17 - 1) - uVar31 < 3) || (*piVar58 != *(int *)((long)puVar42 + 1))) {
                puVar38 = puVar42;
                if (uVar17 < uVar33) {
                  puVar36 = (ulong *)(pBVar9 + uVar33);
                  if (*puVar36 != uVar35) {
LAB_001c9b24:
                    if (uVar60 <= uVar17) {
                      if ((char)uVar57 == (char)uVar41) {
                        uVar41 = uVar41 >> 8;
                        if ((uVar6 < uVar41) && (*(int *)(pBVar11 + uVar41) == (int)*puVar38)) {
                          uVar60 = uVar41 + uVar55;
                          piVar58 = (int *)(pBVar11 + uVar41);
                          goto LAB_001c9b3f;
                        }
                      }
LAB_001c9c82:
                      puVar42 = (ulong *)((long)puVar38 + ((long)puVar38 - (long)src >> 8) + 1);
                      goto LAB_001ca5bb;
                    }
                    piVar58 = (int *)(pBVar9 + uVar60);
                    if (*piVar58 != (int)*puVar38) goto LAB_001c9c82;
LAB_001c9b3f:
                    uVar35 = *(ulong *)((long)puVar38 + 1);
                    uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
                    uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
                    puVar36 = (ulong *)((long)puVar38 + 1);
                    uVar40 = pUVar14[uVar49];
                    uVar41 = pUVar12[uVar46 >> 8];
                    pUVar14[uVar49] = UVar30;
                    puVar42 = puVar38;
                    if (uVar17 < uVar40) {
                      puVar45 = (ulong *)(pBVar9 + uVar40);
                      if (*puVar45 == uVar35) {
                        puVar42 = (ulong *)((long)puVar38 + 9);
                        puVar48 = puVar45 + 1;
                        puVar47 = puVar42;
                        if (puVar42 < puVar1) {
                          uVar46 = *puVar42 ^ *puVar48;
                          uVar35 = 0;
                          if (uVar46 != 0) {
                            for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                            }
                          }
                          pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
                          if (*puVar48 == *puVar42) {
                            puVar47 = (ulong *)((long)puVar38 + 0x11);
                            puVar48 = puVar45 + 2;
                            do {
                              if (puVar1 <= puVar47) goto LAB_001ca065;
                              uVar35 = *puVar48;
                              uVar46 = *puVar47;
                              uVar51 = uVar46 ^ uVar35;
                              uVar49 = 0;
                              if (uVar51 != 0) {
                                for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                                }
                              }
                              pBVar53 = (BYTE *)((long)puVar47 +
                                                ((uVar49 >> 3 & 0x1fffffff) - (long)puVar42));
                              puVar47 = puVar47 + 1;
                              puVar48 = puVar48 + 1;
                            } while (uVar35 == uVar46);
                          }
                        }
                        else {
LAB_001ca065:
                          if ((puVar47 < puVar2) && ((int)*puVar48 == (int)*puVar47)) {
                            puVar47 = (ulong *)((long)puVar47 + 4);
                            puVar48 = (ulong *)((long)puVar48 + 4);
                          }
                          if ((puVar47 < puVar3) && ((short)*puVar48 == (short)*puVar47)) {
                            puVar47 = (ulong *)((long)puVar47 + 2);
                            puVar48 = (ulong *)((long)puVar48 + 2);
                          }
                          if (puVar47 < iEnd) {
                            puVar47 = (ulong *)((long)puVar47 +
                                               (ulong)((BYTE)*puVar48 == (BYTE)*puVar47));
                          }
                          pBVar53 = (BYTE *)((long)puVar47 - (long)puVar42);
                        }
                        pBVar53 = pBVar53 + 8;
                        uVar37 = (int)puVar36 - (int)puVar45;
                        iVar32 = 0xd;
                        puVar42 = puVar36;
                        if (src < puVar36) {
                          piVar24 = (int *)(pBVar9 + ((ulong)uVar40 - 1));
                          do {
                            puVar42 = puVar38;
                            puVar38 = puVar42;
                            if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_001ca1b9;
                            pBVar53 = pBVar53 + 1;
                          } while ((src < puVar42) &&
                                  (bVar16 = iStart < piVar24, piVar24 = (int *)((long)piVar24 + -1),
                                  puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
                        }
                      }
                      else {
LAB_001c9e2c:
                        iVar32 = 0;
                      }
                    }
                    else {
                      iVar32 = 0;
                      if ((char)uVar46 != (char)uVar41) goto LAB_001c9e2c;
                      uVar41 = uVar41 >> 8;
                      puVar45 = (ulong *)(pBVar11 + uVar41);
                      if (mEnd <= puVar45) {
LAB_001cd6d3:
                        __assert_fail("dictMatchL3 < dictEnd",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                                      ,0x1cc,
                                      "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                                     );
                      }
                      if ((uVar6 < uVar41) && (*puVar45 == uVar35)) {
                        sVar23 = ZSTD_count_2segments
                                           ((BYTE *)((long)puVar38 + 9),(BYTE *)(puVar45 + 1),
                                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                        pBVar53 = (BYTE *)(sVar23 + 8);
                        uVar37 = UVar30 - (uVar55 + uVar41);
                        iVar32 = 0xd;
                        puVar42 = puVar36;
                        if (src < puVar36) {
                          piVar24 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
                          do {
                            if ((BYTE)*puVar38 != (BYTE)*piVar24) goto LAB_001ca1b9;
                            pBVar53 = pBVar53 + 1;
                            puVar42 = puVar38;
                          } while ((src < puVar38) &&
                                  (bVar16 = piVar44 < piVar24, piVar24 = (int *)((long)piVar24 + -1)
                                  , puVar38 = (ulong *)((long)puVar38 + -1), bVar16));
                        }
                      }
                    }
                    goto LAB_001c9e38;
                  }
                  puVar38 = puVar42 + 1;
                  puVar47 = puVar36 + 1;
                  puVar45 = puVar38;
                  if (puVar38 < puVar1) {
                    uVar46 = *puVar38 ^ *puVar47;
                    uVar35 = 0;
                    if (uVar46 != 0) {
                      for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                      }
                    }
                    pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
                    if (*puVar47 == *puVar38) {
                      puVar45 = puVar42 + 2;
                      puVar47 = puVar36 + 2;
                      do {
                        if (puVar1 <= puVar45) goto LAB_001c9d7c;
                        uVar35 = *puVar47;
                        uVar46 = *puVar45;
                        uVar51 = uVar46 ^ uVar35;
                        uVar49 = 0;
                        if (uVar51 != 0) {
                          for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                          }
                        }
                        pBVar53 = (BYTE *)((long)puVar45 +
                                          ((uVar49 >> 3 & 0x1fffffff) - (long)puVar38));
                        puVar45 = puVar45 + 1;
                        puVar47 = puVar47 + 1;
                      } while (uVar35 == uVar46);
                    }
                  }
                  else {
LAB_001c9d7c:
                    if ((puVar45 < puVar2) && ((int)*puVar47 == (int)*puVar45)) {
                      puVar45 = (ulong *)((long)puVar45 + 4);
                      puVar47 = (ulong *)((long)puVar47 + 4);
                    }
                    if ((puVar45 < puVar3) && ((short)*puVar47 == (short)*puVar45)) {
                      puVar45 = (ulong *)((long)puVar45 + 2);
                      puVar47 = (ulong *)((long)puVar47 + 2);
                    }
                    if (puVar45 < iEnd) {
                      puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar47 == (BYTE)*puVar45))
                      ;
                    }
                    pBVar53 = (BYTE *)((long)puVar45 - (long)puVar38);
                  }
                  pBVar53 = pBVar53 + 8;
                  uVar37 = (int)puVar42 - (int)puVar36;
                  if (src < puVar42) {
                    piVar58 = (int *)(pBVar9 + ((ulong)uVar33 - 1));
                    puVar38 = (ulong *)((long)puVar42 + -1);
                    do {
                      if ((BYTE)*puVar38 != (BYTE)*piVar58) {
                        puVar42 = (ulong *)((long)puVar38 + 1);
                        goto LAB_001ca1de;
                      }
                      pBVar53 = pBVar53 + 1;
                      puVar42 = (ulong *)((long)puVar38 + -1);
                    } while ((src < puVar38) &&
                            (bVar16 = iStart < piVar58, piVar58 = (int *)((long)piVar58 + -1),
                            puVar38 = puVar42, bVar16));
                    goto LAB_001c9e1a;
                  }
                  goto LAB_001ca1de;
                }
                if ((char)uVar46 != (char)uVar40) goto LAB_001c9b24;
                uVar40 = uVar40 >> 8;
                puVar38 = (ulong *)(pBVar11 + uVar40);
                if (mEnd <= puVar38) {
LAB_001cd638:
                  __assert_fail("dictMatchL < dictEnd",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                                ,0x198,
                                "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                               );
                }
                iVar32 = 0;
                if ((uVar6 < uVar40) && (*puVar38 == uVar35)) {
                  sVar23 = ZSTD_count_2segments
                                     ((BYTE *)(puVar42 + 1),(BYTE *)(puVar38 + 1),(BYTE *)iEnd,
                                      (BYTE *)mEnd,(BYTE *)iStart);
                  pBVar53 = (BYTE *)(sVar23 + 8);
                  uVar37 = UVar54 - (uVar40 + uVar55);
                  iVar32 = 0xd;
                  if (src < puVar42) {
                    piVar58 = (int *)(pBVar11 + ((ulong)uVar40 - 1));
                    do {
                      puVar38 = (ulong *)((long)puVar42 + -1);
                      if ((*(BYTE *)puVar38 != (BYTE)*piVar58) ||
                         (pBVar53 = pBVar53 + 1, puVar42 = puVar38, puVar38 <= src)) break;
                      bVar16 = piVar44 < piVar58;
                      piVar58 = (int *)((long)piVar58 + -1);
                    } while (bVar16);
                  }
                }
                if (iVar32 == 0xd) goto LAB_001ca1de;
                puVar38 = puVar42;
                if (iVar32 == 0) goto LAB_001c9b24;
                goto LAB_001ca5bb;
              }
              puVar38 = iEnd;
              if (uVar31 < uVar17) {
                puVar38 = mEnd;
              }
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar42 + 5),(BYTE *)(piVar58 + 1),(BYTE *)iEnd,
                                  (BYTE *)puVar38,(BYTE *)iStart);
              if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                  seqStore->maxNbSeq) {
                if (seqStore->maxNbLit < 0x20001) {
                  puVar42 = (ulong *)((long)puVar42 + 1);
                  uVar35 = (long)puVar42 - (long)src;
                  puVar38 = (ulong *)seqStore->lit;
                  if ((BYTE *)((long)puVar38 + uVar35) <= seqStore->litStart + seqStore->maxNbLit) {
                    if (puVar42 <= iEnd) {
                      if (puVar22 < puVar42) {
                        ZSTD_safecopyLiterals
                                  ((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
                      }
                      else {
                        uVar46 = *(ulong *)((long)src + 8);
                        *puVar38 = *src;
                        puVar38[1] = uVar46;
                        if (0x10 < uVar35) {
                          pBVar59 = seqStore->lit;
                          if (0xffffffffffffffe0 <
                              (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10))))
                          goto LAB_001cd619;
                          uVar46 = *(ulong *)((long)src + 0x18);
                          *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
                          *(ulong *)(pBVar59 + 0x18) = uVar46;
                          if (0x20 < (long)uVar35) {
                            lVar39 = 0;
                            do {
                              puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
                              uVar18 = puVar5[1];
                              pBVar53 = pBVar59 + lVar39 + 0x20;
                              *(undefined8 *)pBVar53 = *puVar5;
                              *(undefined8 *)(pBVar53 + 8) = uVar18;
                              puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
                              uVar18 = puVar5[1];
                              *(undefined8 *)(pBVar53 + 0x10) = *puVar5;
                              *(undefined8 *)(pBVar53 + 0x18) = uVar18;
                              lVar39 = lVar39 + 0x20;
                            } while (pBVar53 + 0x20 < pBVar59 + uVar35);
                          }
                        }
                      }
                      seqStore->lit = seqStore->lit + uVar35;
                      if (0xffff < uVar35) {
                        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5fa;
                        seqStore->longLengthType = ZSTD_llt_literalLength;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                      pBVar53 = (BYTE *)(sVar23 + 4);
                      psVar25 = seqStore->sequences;
                      psVar25->litLength = (U16)uVar35;
                      psVar25->offBase = 1;
                      if (pBVar53 < (BYTE *)0x3) goto LAB_001cd540;
                      pBVar59 = (BYTE *)(sVar23 + 1);
                      if (pBVar59 < (BYTE *)0x10000) goto LAB_001ca356;
                      if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001ca330;
                      goto LAB_001cd5bc;
                    }
                    goto LAB_001cd59d;
                  }
                  goto LAB_001cd57e;
                }
                goto LAB_001cd55f;
              }
              goto LAB_001cd521;
            }
LAB_001cd657:
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
LAB_001cd4f2:
          *rep = local_144;
          rep[1] = local_11c;
          return (long)iEnd - (long)src;
        }
LAB_001cd6b4:
        __assert_fail("offset_2 <= dictAndPrefixLength",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                      ,0x169,
                      "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
LAB_001cd695:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                    ,0x168,
                    "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
LAB_001cd676:
    __assert_fail("ms->window.dictLimit + (1U << cParams->windowLog) >= endIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                  ,0x15a,
                  "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                 );
  }
  if (uVar41 < uVar40) goto LAB_001cd676;
  if (ms->prefetchCDictTables != 0) {
    pBVar59 = (BYTE *)(4L << (bVar26 & 0x3f));
    if (uVar31 < 0x3e) {
      pBVar53 = (BYTE *)0x0;
      do {
        pBVar53 = pBVar53 + 0x40;
      } while (pBVar53 < pBVar59);
    }
    if (uVar60 < 0x3e) {
      uVar35 = 0;
      do {
        uVar35 = uVar35 + 0x40;
      } while (uVar35 < (ulong)(4L << (bVar27 & 0x3f)));
    }
  }
  if (uVar52 < local_144) goto LAB_001cd695;
  puVar42 = (ulong *)((long)src + (ulong)(uVar52 == 0));
  if (uVar52 < local_11c) goto LAB_001cd6b4;
  if (puVar21 <= puVar42) goto LAB_001cd4f2;
  if ((((0x20 < uVar7) || (0x20 < uVar8)) || (0x20 < uVar37)) || (0x20 < uVar33)) goto LAB_001cd657;
  bVar28 = 0x40 - cVar19;
  bVar29 = 0x20 - cVar20;
  puVar1 = (ulong *)((long)iEnd + -7);
  puVar2 = (ulong *)((long)iEnd + -3);
  puVar3 = (ulong *)((long)iEnd + -1);
  puVar22 = iEnd + -4;
  pBVar53 = pBVar9 + -1;
  local_130 = pBVar53;
LAB_001cc69c:
  uVar46 = *puVar42 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
  uVar31 = (int)*puVar42 * -0x61c8864f;
  uVar60 = uVar31 >> (bVar29 & 0x1f);
  uVar35 = *puVar42 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
  uVar31 = uVar31 >> (0x18 - bVar27 & 0x1f);
  uVar37 = pUVar12[uVar35 >> 8];
  uVar40 = pUVar13[uVar31 >> 8];
  UVar54 = (int)puVar42 - iVar50;
  uVar41 = pUVar14[uVar46];
  UVar30 = UVar54 + 1;
  uVar33 = UVar30 - local_144;
  piVar58 = (int *)(pBVar9 + uVar33);
  if (uVar33 < uVar17) {
    piVar58 = (int *)(pBVar11 + (uVar33 - uVar55));
  }
  uVar34 = pUVar15[uVar60];
  pUVar15[uVar60] = UVar54;
  pUVar14[uVar46] = UVar54;
  if ((2 < (uVar17 - 1) - uVar33) && (*piVar58 == *(int *)((long)puVar42 + 1))) {
    puVar38 = iEnd;
    if (uVar33 < uVar17) {
      puVar38 = mEnd;
    }
    sVar23 = ZSTD_count_2segments
                       ((BYTE *)((long)puVar42 + 5),(BYTE *)(piVar58 + 1),(BYTE *)iEnd,
                        (BYTE *)puVar38,(BYTE *)iStart);
    if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
        seqStore->maxNbSeq) {
      if (seqStore->maxNbLit < 0x20001) {
        puVar42 = (ulong *)((long)puVar42 + 1);
        uVar35 = (long)puVar42 - (long)src;
        puVar38 = (ulong *)seqStore->lit;
        if ((BYTE *)((long)puVar38 + uVar35) <= seqStore->litStart + seqStore->maxNbLit) {
          if (puVar42 <= iEnd) {
            if (puVar22 < puVar42) {
              ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
            }
            else {
              uVar46 = *(ulong *)((long)src + 8);
              *puVar38 = *src;
              puVar38[1] = uVar46;
              if (0x10 < uVar35) {
                pBVar59 = seqStore->lit;
                if (0xffffffffffffffe0 <
                    (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10))))
                goto LAB_001cd619;
                uVar46 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar59 + 0x18) = uVar46;
                if (0x20 < (long)uVar35) {
                  lVar39 = 0;
                  do {
                    puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
                    uVar18 = puVar5[1];
                    pBVar43 = pBVar59 + lVar39 + 0x20;
                    *(undefined8 *)pBVar43 = *puVar5;
                    *(undefined8 *)(pBVar43 + 8) = uVar18;
                    puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
                    uVar18 = puVar5[1];
                    *(undefined8 *)(pBVar43 + 0x10) = *puVar5;
                    *(undefined8 *)(pBVar43 + 0x18) = uVar18;
                    lVar39 = lVar39 + 0x20;
                  } while (pBVar43 + 0x20 < pBVar59 + uVar35);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar35;
            if (0xffff < uVar35) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5fa;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            pBVar59 = (BYTE *)(sVar23 + 4);
            psVar25 = seqStore->sequences;
            psVar25->litLength = (U16)uVar35;
            psVar25->offBase = 1;
            if (pBVar59 < (BYTE *)0x3) goto LAB_001cd540;
            pBVar43 = (BYTE *)(sVar23 + 1);
            if (pBVar43 < (BYTE *)0x10000) goto LAB_001cd26e;
            if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001cd248;
            goto LAB_001cd5bc;
          }
          goto LAB_001cd59d;
        }
        goto LAB_001cd57e;
      }
      goto LAB_001cd55f;
    }
    goto LAB_001cd521;
  }
  puVar38 = puVar42;
  if (uVar41 <= uVar17) {
    if ((char)uVar35 != (char)uVar37) goto LAB_001cc9fc;
    uVar37 = uVar37 >> 8;
    puVar38 = (ulong *)(pBVar11 + uVar37);
    if (puVar38 < mEnd) {
      iVar32 = 0;
      if ((uVar6 < uVar37) && (iVar32 = 0, *puVar38 == *puVar42)) {
        sVar23 = ZSTD_count_2segments
                           ((BYTE *)(puVar42 + 1),(BYTE *)(puVar38 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                            (BYTE *)iStart);
        pBVar59 = (BYTE *)(sVar23 + 8);
        local_130 = (BYTE *)(ulong)(UVar54 - (uVar37 + uVar55));
        iVar32 = 0xd;
        if (src < puVar42) {
          piVar58 = (int *)(pBVar11 + ((ulong)uVar37 - 1));
          do {
            puVar38 = (ulong *)((long)puVar42 + -1);
            if ((*(BYTE *)puVar38 != (BYTE)*piVar58) ||
               (pBVar59 = pBVar59 + 1, puVar42 = puVar38, puVar38 <= src)) break;
            bVar16 = piVar44 < piVar58;
            piVar58 = (int *)((long)piVar58 + -1);
          } while (bVar16);
        }
      }
      if (iVar32 == 0xd) goto LAB_001cd0f6;
      puVar38 = puVar42;
      if (iVar32 == 0) goto LAB_001cc9fc;
      goto LAB_001cd4c9;
    }
    goto LAB_001cd638;
  }
  puVar36 = (ulong *)(pBVar9 + uVar41);
  if (*puVar36 == *puVar42) {
    puVar45 = puVar42 + 1;
    puVar38 = puVar36 + 1;
    puVar47 = puVar45;
    if (puVar45 < puVar1) {
      uVar46 = *puVar45 ^ *puVar38;
      uVar35 = 0;
      if (uVar46 != 0) {
        for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
        }
      }
      pBVar59 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
      if (*puVar38 == *puVar45) {
        puVar47 = puVar42 + 2;
        puVar38 = puVar36 + 2;
        do {
          if (puVar1 <= puVar47) goto LAB_001ccc5e;
          uVar35 = *puVar38;
          uVar46 = *puVar47;
          uVar51 = uVar46 ^ uVar35;
          uVar49 = 0;
          if (uVar51 != 0) {
            for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
            }
          }
          pBVar59 = (BYTE *)((long)puVar47 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar45));
          puVar47 = puVar47 + 1;
          puVar38 = puVar38 + 1;
        } while (uVar35 == uVar46);
      }
    }
    else {
LAB_001ccc5e:
      if ((puVar47 < puVar2) && ((int)*puVar38 == (int)*puVar47)) {
        puVar47 = (ulong *)((long)puVar47 + 4);
        puVar38 = (ulong *)((long)puVar38 + 4);
      }
      if ((puVar47 < puVar3) && ((short)*puVar38 == (short)*puVar47)) {
        puVar47 = (ulong *)((long)puVar47 + 2);
        puVar38 = (ulong *)((long)puVar38 + 2);
      }
      if (puVar47 < iEnd) {
        puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar38 == (BYTE)*puVar47));
      }
      pBVar59 = (BYTE *)((long)puVar47 - (long)puVar45);
    }
    pBVar59 = pBVar59 + 8;
    local_130 = (BYTE *)(ulong)(uint)((int)puVar42 - (int)puVar36);
    if (src < puVar42) {
      piVar58 = (int *)(pBVar53 + uVar41);
      puVar38 = (ulong *)((long)puVar42 + -1);
      do {
        if ((BYTE)*puVar38 != (BYTE)*piVar58) {
          puVar42 = (ulong *)((long)puVar38 + 1);
          goto LAB_001cd0f6;
        }
        pBVar59 = pBVar59 + 1;
        puVar42 = (ulong *)((long)puVar38 + -1);
      } while ((src < puVar38) &&
              (bVar16 = iStart < piVar58, piVar58 = (int *)((long)piVar58 + -1), puVar38 = puVar42,
              bVar16));
      goto LAB_001cccfe;
    }
    goto LAB_001cd0f6;
  }
LAB_001cc9fc:
  if (uVar34 <= uVar17) {
    if ((char)uVar31 == (char)uVar40) {
      uVar40 = uVar40 >> 8;
      if ((uVar6 < uVar40) && (*(int *)(pBVar11 + uVar40) == (int)*puVar38)) {
        uVar34 = uVar40 + uVar55;
        piVar58 = (int *)(pBVar11 + uVar40);
        goto LAB_001cca18;
      }
    }
LAB_001ccb63:
    puVar42 = (ulong *)((long)puVar38 + ((long)puVar38 - (long)src >> 8) + 1);
    goto LAB_001cd4c9;
  }
  piVar58 = (int *)(pBVar9 + uVar34);
  if (*piVar58 != (int)*puVar38) goto LAB_001ccb63;
LAB_001cca18:
  uVar35 = *(ulong *)((long)puVar38 + 1);
  uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
  uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
  puVar42 = (ulong *)((long)puVar38 + 1);
  uVar37 = pUVar14[uVar49];
  uVar40 = pUVar12[uVar46 >> 8];
  pUVar14[uVar49] = UVar30;
  if (uVar37 <= uVar17) {
    if ((char)uVar46 == (char)uVar40) {
      uVar40 = uVar40 >> 8;
      puVar36 = (ulong *)(pBVar11 + uVar40);
      if (mEnd <= puVar36) goto LAB_001cd6d3;
      if ((uVar6 < uVar40) && (*puVar36 == uVar35)) {
        sVar23 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar38 + 9),(BYTE *)(puVar36 + 1),(BYTE *)iEnd,
                            (BYTE *)mEnd,(BYTE *)iStart);
        pBVar59 = (BYTE *)(sVar23 + 8);
        uVar41 = UVar30 - (uVar55 + uVar40);
        iVar32 = 0xd;
        if (src < puVar42) {
          piVar24 = (int *)(pBVar11 + ((ulong)uVar40 - 1));
          do {
            puVar42 = puVar38;
            if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_001cd0b3;
            pBVar59 = pBVar59 + 1;
          } while ((src < puVar42) &&
                  (bVar16 = piVar44 < piVar24, piVar24 = (int *)((long)piVar24 + -1),
                  puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
        }
        goto LAB_001ccde0;
      }
    }
LAB_001ccdd8:
    iVar32 = 0;
    uVar41 = (uint)local_130;
    puVar42 = puVar38;
    goto LAB_001ccde0;
  }
  puVar36 = (ulong *)(pBVar9 + uVar37);
  if (*puVar36 != uVar35) goto LAB_001ccdd8;
  puVar47 = (ulong *)((long)puVar38 + 9);
  puVar45 = puVar36 + 1;
  puVar48 = puVar47;
  if (puVar47 < puVar1) {
    uVar46 = *puVar47 ^ *puVar45;
    uVar35 = 0;
    if (uVar46 != 0) {
      for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
      }
    }
    pBVar59 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
    if (*puVar45 == *puVar47) {
      puVar48 = (ulong *)((long)puVar38 + 0x11);
      puVar45 = puVar36 + 2;
      do {
        if (puVar1 <= puVar48) goto LAB_001ccf4f;
        uVar35 = *puVar45;
        uVar46 = *puVar48;
        uVar51 = uVar46 ^ uVar35;
        uVar49 = 0;
        if (uVar51 != 0) {
          for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
          }
        }
        pBVar59 = (BYTE *)((long)puVar48 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar47));
        puVar48 = puVar48 + 1;
        puVar45 = puVar45 + 1;
      } while (uVar35 == uVar46);
    }
  }
  else {
LAB_001ccf4f:
    if ((puVar48 < puVar2) && ((int)*puVar45 == (int)*puVar48)) {
      puVar48 = (ulong *)((long)puVar48 + 4);
      puVar45 = (ulong *)((long)puVar45 + 4);
    }
    if ((puVar48 < puVar3) && ((short)*puVar45 == (short)*puVar48)) {
      puVar48 = (ulong *)((long)puVar48 + 2);
      puVar45 = (ulong *)((long)puVar45 + 2);
    }
    if (puVar48 < iEnd) {
      puVar48 = (ulong *)((long)puVar48 + (ulong)((BYTE)*puVar45 == (BYTE)*puVar48));
    }
    pBVar59 = (BYTE *)((long)puVar48 - (long)puVar47);
  }
  pBVar59 = pBVar59 + 8;
  uVar41 = (int)puVar42 - (int)puVar36;
  iVar32 = 0xd;
  if (src < puVar42) {
    piVar24 = (int *)(pBVar53 + uVar37);
    do {
      puVar42 = puVar38;
      if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_001cd0b3;
      pBVar59 = pBVar59 + 1;
    } while ((src < puVar42) &&
            (bVar16 = iStart < piVar24, piVar24 = (int *)((long)piVar24 + -1),
            puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
  }
LAB_001ccde0:
  if (iVar32 == 0xd) {
    local_130 = (BYTE *)(ulong)uVar41;
    goto LAB_001cd0f6;
  }
  if (iVar32 != 0) {
    local_130 = (BYTE *)(ulong)uVar41;
    goto LAB_001cd4c9;
  }
  puVar36 = (ulong *)((long)puVar42 + 4);
  puVar38 = (ulong *)(piVar58 + 1);
  if (uVar34 < uVar17) {
    sVar23 = ZSTD_count_2segments
                       ((BYTE *)puVar36,(BYTE *)puVar38,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
    pBVar59 = (BYTE *)(sVar23 + 4);
    local_130 = (BYTE *)(ulong)(UVar54 - uVar34);
    if ((piVar44 < piVar58) && (src < puVar42)) {
      puVar38 = (ulong *)((long)puVar42 + -1);
      do {
        piVar58 = (int *)((long)piVar58 + -1);
        if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_001cd0ab;
        pBVar59 = pBVar59 + 1;
        puVar42 = (ulong *)((long)puVar38 + -1);
      } while ((src < puVar38) && (puVar38 = puVar42, piVar44 < piVar58));
LAB_001cccfe:
      puVar42 = (ulong *)((long)puVar42 + 1);
    }
  }
  else {
    puVar45 = puVar36;
    if (puVar36 < puVar1) {
      uVar46 = *puVar36 ^ *puVar38;
      uVar35 = 0;
      if (uVar46 != 0) {
        for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
        }
      }
      pBVar59 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
      if (*puVar38 == *puVar36) {
        puVar45 = (ulong *)((long)puVar42 + 0xc);
        puVar38 = (ulong *)(piVar58 + 3);
        do {
          if (puVar1 <= puVar45) goto LAB_001cd007;
          uVar35 = *puVar38;
          uVar46 = *puVar45;
          uVar51 = uVar46 ^ uVar35;
          uVar49 = 0;
          if (uVar51 != 0) {
            for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
            }
          }
          pBVar59 = (BYTE *)((long)puVar45 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar36));
          puVar45 = puVar45 + 1;
          puVar38 = puVar38 + 1;
        } while (uVar35 == uVar46);
      }
    }
    else {
LAB_001cd007:
      if ((puVar45 < puVar2) && ((int)*puVar38 == (int)*puVar45)) {
        puVar45 = (ulong *)((long)puVar45 + 4);
        puVar38 = (ulong *)((long)puVar38 + 4);
      }
      if ((puVar45 < puVar3) && ((short)*puVar38 == (short)*puVar45)) {
        puVar45 = (ulong *)((long)puVar45 + 2);
        puVar38 = (ulong *)((long)puVar38 + 2);
      }
      if (puVar45 < iEnd) {
        puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar38 == (BYTE)*puVar45));
      }
      pBVar59 = (BYTE *)((long)puVar45 - (long)puVar36);
    }
    pBVar59 = pBVar59 + 4;
    local_130 = (BYTE *)(ulong)(uint)((int)puVar42 - (int)piVar58);
    if ((iStart < piVar58) && (src < puVar42)) {
      puVar38 = (ulong *)((long)puVar42 + -1);
      do {
        piVar58 = (int *)((long)piVar58 + -1);
        if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_001cd0ab;
        pBVar59 = pBVar59 + 1;
        puVar42 = (ulong *)((long)puVar38 + -1);
      } while ((src < puVar38) && (puVar38 = puVar42, iStart < piVar58));
      goto LAB_001cccfe;
    }
  }
LAB_001cd0f6:
  if ((uint)local_130 == 0) goto LAB_001cd5db;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001cd521;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001cd55f;
  uVar35 = (long)puVar42 - (long)src;
  puVar38 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar38 + uVar35)) goto LAB_001cd57e;
  if (iEnd < puVar42) goto LAB_001cd59d;
  if (puVar22 < puVar42) {
    ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
  }
  else {
    uVar46 = *(ulong *)((long)src + 8);
    *puVar38 = *src;
    puVar38[1] = uVar46;
    if (0x10 < uVar35) {
      pBVar43 = seqStore->lit;
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar43 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_001cd619;
      uVar46 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar43 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar43 + 0x18) = uVar46;
      if (0x20 < (long)uVar35) {
        lVar39 = 0;
        do {
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
          uVar18 = puVar5[1];
          pBVar4 = pBVar43 + lVar39 + 0x20;
          *(undefined8 *)pBVar4 = *puVar5;
          *(undefined8 *)(pBVar4 + 8) = uVar18;
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
          uVar18 = puVar5[1];
          *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
          *(undefined8 *)(pBVar4 + 0x18) = uVar18;
          lVar39 = lVar39 + 0x20;
        } while (pBVar4 + 0x20 < pBVar43 + uVar35);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar35;
  if (0xffff < uVar35) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5fa;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar35;
  psVar25->offBase = (uint)local_130 + 3;
  if (pBVar59 < (BYTE *)0x3) goto LAB_001cd540;
  pBVar43 = pBVar59 + -3;
  local_11c = local_144;
  local_144 = (uint)local_130;
  if ((BYTE *)0xffff < pBVar43) {
    local_144 = (uint)local_130;
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5bc;
LAB_001cd248:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001cd26e:
  psVar25->mlBase = (U16)pBVar43;
  seqStore->sequences = psVar25 + 1;
  src = (void *)((long)puVar42 + (long)pBVar59);
  puVar42 = (ulong *)src;
  if (src <= puVar21) {
    uVar37 = UVar54 + 2;
    pUVar14[(ulong)(*(long *)(pBVar9 + uVar37) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] = uVar37;
    pUVar14[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] =
         ((int)src + -2) - iVar50;
    pUVar15[(uint)(*(int *)(pBVar9 + uVar37) * -0x61c8864f) >> (bVar29 & 0x1f)] = uVar37;
    pUVar15[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar29 & 0x1f)] =
         ((int)src + -1) - iVar50;
    do {
      if (puVar21 < puVar42) break;
      UVar30 = (int)puVar42 - iVar50;
      uVar37 = UVar30 - local_11c;
      pBVar43 = pBVar9;
      if (uVar37 < uVar17) {
        pBVar43 = pBVar11 + -uVar56;
      }
      if (((uVar17 - 1) - uVar37 < 3) || (*(int *)(pBVar43 + uVar37) != (int)*puVar42)) {
        bVar16 = false;
        uVar37 = local_11c;
      }
      else {
        puVar38 = iEnd;
        if (uVar37 < uVar17) {
          puVar38 = mEnd;
        }
        sVar23 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar42 + 4),(BYTE *)((long)(pBVar43 + uVar37) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar38,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001cd521;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001cd55f;
        puVar38 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_001cd57e;
        if (iEnd < src) goto LAB_001cd59d;
        if (puVar22 < src) {
          ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)src,(BYTE *)puVar22);
        }
        else {
          uVar35 = *(ulong *)((long)src + 8);
          *puVar38 = *src;
          puVar38[1] = uVar35;
        }
        psVar25 = seqStore->sequences;
        psVar25->litLength = 0;
        psVar25->offBase = 1;
        if (sVar23 + 4 < 3) goto LAB_001cd540;
        if (0xffff < sVar23 + 1) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5bc;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar25->mlBase = (U16)(sVar23 + 1);
        seqStore->sequences = psVar25 + 1;
        pUVar15[(uint)((int)*puVar42 * -0x61c8864f) >> (bVar29 & 0x1f)] = UVar30;
        pUVar14[*puVar42 * -0x30e44323485a9b9d >> (bVar28 & 0x3f)] = UVar30;
        src = (void *)(sVar23 + 4 + (long)puVar42);
        bVar16 = true;
        puVar42 = (ulong *)src;
        uVar37 = local_144;
        local_144 = local_11c;
      }
      local_11c = uVar37;
    } while (bVar16);
  }
LAB_001cd4c9:
  if (puVar21 <= puVar42) goto LAB_001cd4f2;
  goto LAB_001cc69c;
LAB_001cc0ea:
  iVar32 = 0xd;
  puVar42 = (ulong *)((long)puVar42 + 1);
LAB_001cbd69:
  if (iVar32 != 0xd) {
    if (iVar32 != 0) goto LAB_001cc4ec;
    puVar38 = (ulong *)((long)puVar42 + 4);
    puVar36 = (ulong *)(piVar58 + 1);
    if (uVar60 < uVar17) {
      sVar23 = ZSTD_count_2segments
                         ((BYTE *)puVar38,(BYTE *)puVar36,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
      pBVar53 = (BYTE *)(sVar23 + 4);
      uVar37 = UVar54 - uVar60;
      if ((piVar44 < piVar58) && (src < puVar42)) {
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          piVar58 = (int *)((long)piVar58 + -1);
          if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_001cc0e2;
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) && (puVar38 = puVar42, piVar44 < piVar58));
LAB_001cbd4b:
        puVar42 = (ulong *)((long)puVar42 + 1);
      }
    }
    else {
      puVar45 = puVar38;
      if (puVar38 < puVar1) {
        uVar46 = *puVar38 ^ *puVar36;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar36 == *puVar38) {
          puVar45 = (ulong *)((long)puVar42 + 0xc);
          puVar36 = (ulong *)(piVar58 + 3);
          do {
            if (puVar1 <= puVar45) goto LAB_001cc047;
            uVar35 = *puVar36;
            uVar46 = *puVar45;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar45 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar38));
            puVar45 = puVar45 + 1;
            puVar36 = puVar36 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_001cc047:
        if ((puVar45 < puVar2) && ((int)*puVar36 == (int)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 4);
          puVar36 = (ulong *)((long)puVar36 + 4);
        }
        if ((puVar45 < puVar3) && ((short)*puVar36 == (short)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 2);
          puVar36 = (ulong *)((long)puVar36 + 2);
        }
        if (puVar45 < iEnd) {
          puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar45));
        }
        pBVar53 = (BYTE *)((long)puVar45 - (long)puVar38);
      }
      pBVar53 = pBVar53 + 4;
      uVar37 = (int)puVar42 - (int)piVar58;
      if ((iStart < piVar58) && (src < puVar42)) {
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          piVar58 = (int *)((long)piVar58 + -1);
          if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_001cc0e2;
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) && (puVar38 = puVar42, iStart < piVar58));
        goto LAB_001cbd4b;
      }
    }
  }
  goto LAB_001cc10f;
LAB_001cc0e2:
  puVar42 = (ulong *)((long)puVar38 + 1);
LAB_001cc10f:
  if (uVar37 == 0) goto LAB_001cd5db;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001cd521;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001cd55f;
  uVar35 = (long)puVar42 - (long)src;
  puVar38 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar38 + uVar35)) goto LAB_001cd57e;
  if (iEnd < puVar42) goto LAB_001cd59d;
  if (puVar22 < puVar42) {
    ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
  }
  else {
    uVar46 = *(ulong *)((long)src + 8);
    *puVar38 = *src;
    puVar38[1] = uVar46;
    if (0x10 < uVar35) {
      pBVar59 = seqStore->lit;
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_001cd619;
      uVar46 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar59 + 0x18) = uVar46;
      if (0x20 < (long)uVar35) {
        lVar39 = 0;
        do {
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
          uVar18 = puVar5[1];
          pBVar43 = pBVar59 + lVar39 + 0x20;
          *(undefined8 *)pBVar43 = *puVar5;
          *(undefined8 *)(pBVar43 + 8) = uVar18;
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
          uVar18 = puVar5[1];
          *(undefined8 *)(pBVar43 + 0x10) = *puVar5;
          *(undefined8 *)(pBVar43 + 0x18) = uVar18;
          lVar39 = lVar39 + 0x20;
        } while (pBVar43 + 0x20 < pBVar59 + uVar35);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar35;
  if (0xffff < uVar35) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5fa;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar35;
  psVar25->offBase = uVar37 + 3;
  if (pBVar53 < (BYTE *)0x3) goto LAB_001cd540;
  pBVar59 = pBVar53 + -3;
  local_11c = local_144;
  local_144 = uVar37;
  if ((BYTE *)0xffff < pBVar59) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5bc;
LAB_001cc261:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001cc287:
  psVar25->mlBase = (U16)pBVar59;
  seqStore->sequences = psVar25 + 1;
  puVar42 = (ulong *)((long)puVar42 + (long)pBVar53);
  src = puVar42;
  if (puVar42 <= puVar21) {
    uVar40 = UVar54 + 2;
    lVar39 = *(long *)(pBVar9 + uVar40);
    pUVar14[(ulong)(lVar39 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] = uVar40;
    pUVar14[(ulong)(*(long *)((long)puVar42 + -2) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] =
         ((int)puVar42 + -2) - iVar50;
    pUVar15[(ulong)(lVar39 * -0x30e4432345000000) >> (bVar29 & 0x3f)] = uVar40;
    pUVar15[(ulong)(*(long *)((long)puVar42 + -1) * -0x30e4432345000000) >> (bVar29 & 0x3f)] =
         ((int)puVar42 + -1) - iVar50;
    do {
      if (puVar21 < puVar42) break;
      UVar30 = (int)puVar42 - iVar50;
      uVar40 = UVar30 - local_11c;
      pBVar59 = pBVar9;
      if (uVar40 < uVar17) {
        pBVar59 = pBVar11 + -uVar56;
      }
      if (((uVar17 - 1) - uVar40 < 3) || (*(int *)(pBVar59 + uVar40) != (int)*puVar42)) {
        bVar16 = false;
        uVar40 = local_11c;
      }
      else {
        puVar38 = iEnd;
        if (uVar40 < uVar17) {
          puVar38 = mEnd;
        }
        sVar23 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar42 + 4),(BYTE *)((long)(pBVar59 + uVar40) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar38,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001cd521;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001cd55f;
        puVar38 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_001cd57e;
        if (iEnd < src) goto LAB_001cd59d;
        if (puVar22 < src) {
          ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)src,(BYTE *)puVar22);
        }
        else {
          uVar35 = *(ulong *)((long)src + 8);
          *puVar38 = *src;
          puVar38[1] = uVar35;
        }
        psVar25 = seqStore->sequences;
        psVar25->litLength = 0;
        psVar25->offBase = 1;
        if (sVar23 + 4 < 3) goto LAB_001cd540;
        if (0xffff < sVar23 + 1) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5bc;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar25->mlBase = (U16)(sVar23 + 1);
        seqStore->sequences = psVar25 + 1;
        uVar35 = *puVar42;
        pUVar15[uVar35 * -0x30e4432345000000 >> (bVar29 & 0x3f)] = UVar30;
        pUVar14[uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f)] = UVar30;
        puVar42 = (ulong *)(sVar23 + 4 + (long)puVar42);
        bVar16 = true;
        src = puVar42;
        uVar40 = local_144;
        local_144 = local_11c;
      }
      local_11c = uVar40;
    } while (bVar16);
  }
LAB_001cc4ec:
  if (puVar21 <= puVar42) goto LAB_001cd4f2;
  goto LAB_001cb70d;
LAB_001cb14e:
  iVar32 = 0xd;
  puVar42 = (ulong *)((long)puVar42 + 1);
LAB_001cadd5:
  if (iVar32 != 0xd) {
    if (iVar32 != 0) goto LAB_001cb54b;
    puVar38 = (ulong *)((long)puVar42 + 4);
    puVar36 = (ulong *)(piVar58 + 1);
    if (uVar60 < uVar17) {
      sVar23 = ZSTD_count_2segments
                         ((BYTE *)puVar38,(BYTE *)puVar36,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
      pBVar53 = (BYTE *)(sVar23 + 4);
      uVar37 = UVar54 - uVar60;
      if ((piVar44 < piVar58) && (src < puVar42)) {
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          piVar58 = (int *)((long)piVar58 + -1);
          if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_001cb146;
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) && (puVar38 = puVar42, piVar44 < piVar58));
LAB_001cadb7:
        puVar42 = (ulong *)((long)puVar42 + 1);
      }
    }
    else {
      puVar45 = puVar38;
      if (puVar38 < puVar1) {
        uVar46 = *puVar38 ^ *puVar36;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar36 == *puVar38) {
          puVar45 = (ulong *)((long)puVar42 + 0xc);
          puVar36 = (ulong *)(piVar58 + 3);
          do {
            if (puVar1 <= puVar45) goto LAB_001cb0a5;
            uVar35 = *puVar36;
            uVar46 = *puVar45;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar45 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar38));
            puVar45 = puVar45 + 1;
            puVar36 = puVar36 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_001cb0a5:
        if ((puVar45 < puVar2) && ((int)*puVar36 == (int)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 4);
          puVar36 = (ulong *)((long)puVar36 + 4);
        }
        if ((puVar45 < puVar3) && ((short)*puVar36 == (short)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 2);
          puVar36 = (ulong *)((long)puVar36 + 2);
        }
        if (puVar45 < iEnd) {
          puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar45));
        }
        pBVar53 = (BYTE *)((long)puVar45 - (long)puVar38);
      }
      pBVar53 = pBVar53 + 4;
      uVar37 = (int)puVar42 - (int)piVar58;
      if ((iStart < piVar58) && (src < puVar42)) {
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          piVar58 = (int *)((long)piVar58 + -1);
          if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_001cb146;
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) && (puVar38 = puVar42, iStart < piVar58));
        goto LAB_001cadb7;
      }
    }
  }
  goto LAB_001cb173;
LAB_001cb146:
  puVar42 = (ulong *)((long)puVar38 + 1);
LAB_001cb173:
  if (uVar37 == 0) goto LAB_001cd5db;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001cd521;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001cd55f;
  uVar35 = (long)puVar42 - (long)src;
  puVar38 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar38 + uVar35)) goto LAB_001cd57e;
  if (iEnd < puVar42) goto LAB_001cd59d;
  if (puVar22 < puVar42) {
    ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
  }
  else {
    uVar46 = *(ulong *)((long)src + 8);
    *puVar38 = *src;
    puVar38[1] = uVar46;
    if (0x10 < uVar35) {
      pBVar59 = seqStore->lit;
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_001cd619;
      uVar46 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar59 + 0x18) = uVar46;
      if (0x20 < (long)uVar35) {
        lVar39 = 0;
        do {
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
          uVar18 = puVar5[1];
          pBVar43 = pBVar59 + lVar39 + 0x20;
          *(undefined8 *)pBVar43 = *puVar5;
          *(undefined8 *)(pBVar43 + 8) = uVar18;
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
          uVar18 = puVar5[1];
          *(undefined8 *)(pBVar43 + 0x10) = *puVar5;
          *(undefined8 *)(pBVar43 + 0x18) = uVar18;
          lVar39 = lVar39 + 0x20;
        } while (pBVar43 + 0x20 < pBVar59 + uVar35);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar35;
  if (0xffff < uVar35) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5fa;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar35;
  psVar25->offBase = uVar37 + 3;
  if (pBVar53 < (BYTE *)0x3) goto LAB_001cd540;
  pBVar59 = pBVar53 + -3;
  local_11c = local_144;
  local_144 = uVar37;
  if ((BYTE *)0xffff < pBVar59) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5bc;
LAB_001cb2cc:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001cb2f2:
  psVar25->mlBase = (U16)pBVar59;
  seqStore->sequences = psVar25 + 1;
  src = (void *)((long)puVar42 + (long)pBVar53);
  puVar42 = (ulong *)src;
  if (src <= puVar21) {
    uVar40 = UVar54 + 2;
    lVar39 = *(long *)(pBVar9 + uVar40);
    pUVar14[(ulong)(lVar39 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] = uVar40;
    pUVar14[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] =
         ((int)src + -2) - iVar50;
    pUVar15[(ulong)(lVar39 * -0x30e4432340650000) >> (bVar29 & 0x3f)] = uVar40;
    pUVar15[(ulong)(*(long *)((long)src + -1) * -0x30e4432340650000) >> (bVar29 & 0x3f)] =
         ((int)src + -1) - iVar50;
    do {
      if (puVar21 < puVar42) break;
      UVar30 = (int)puVar42 - iVar50;
      uVar40 = UVar30 - local_11c;
      pBVar59 = pBVar9;
      if (uVar40 < uVar17) {
        pBVar59 = pBVar11 + -uVar56;
      }
      if (((uVar17 - 1) - uVar40 < 3) || (*(int *)(pBVar59 + uVar40) != (int)*puVar42)) {
        bVar16 = false;
        uVar40 = local_11c;
      }
      else {
        puVar38 = iEnd;
        if (uVar40 < uVar17) {
          puVar38 = mEnd;
        }
        sVar23 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar42 + 4),(BYTE *)((long)(pBVar59 + uVar40) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar38,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001cd521;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001cd55f;
        puVar38 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_001cd57e;
        if (iEnd < src) goto LAB_001cd59d;
        if (puVar22 < src) {
          ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)src,(BYTE *)puVar22);
        }
        else {
          uVar35 = *(ulong *)((long)src + 8);
          *puVar38 = *src;
          puVar38[1] = uVar35;
        }
        psVar25 = seqStore->sequences;
        psVar25->litLength = 0;
        psVar25->offBase = 1;
        if (sVar23 + 4 < 3) goto LAB_001cd540;
        if (0xffff < sVar23 + 1) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5bc;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar25->mlBase = (U16)(sVar23 + 1);
        seqStore->sequences = psVar25 + 1;
        uVar35 = *puVar42;
        pUVar15[uVar35 * -0x30e4432340650000 >> (bVar29 & 0x3f)] = UVar30;
        pUVar14[uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f)] = UVar30;
        src = (void *)(sVar23 + 4 + (long)puVar42);
        bVar16 = true;
        puVar42 = (ulong *)src;
        uVar40 = local_144;
        local_144 = local_11c;
      }
      local_11c = uVar40;
    } while (bVar16);
  }
LAB_001cb54b:
  if (puVar21 <= puVar42) goto LAB_001cd4f2;
  goto LAB_001ca77c;
LAB_001cd0b3:
  iVar32 = 0xd;
  puVar42 = (ulong *)((long)puVar42 + 1);
  goto LAB_001ccde0;
LAB_001cd0ab:
  puVar42 = (ulong *)((long)puVar38 + 1);
  goto LAB_001cd0f6;
LAB_001ca1b9:
  iVar32 = 0xd;
  puVar42 = (ulong *)((long)puVar38 + 1);
LAB_001c9e38:
  if (iVar32 != 0xd) {
    if (iVar32 != 0) goto LAB_001ca5bb;
    puVar38 = (ulong *)((long)puVar42 + 4);
    puVar36 = (ulong *)(piVar58 + 1);
    if (uVar60 < uVar17) {
      sVar23 = ZSTD_count_2segments
                         ((BYTE *)puVar38,(BYTE *)puVar36,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
      pBVar53 = (BYTE *)(sVar23 + 4);
      uVar37 = UVar54 - uVar60;
      if ((piVar44 < piVar58) && (src < puVar42)) {
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          piVar58 = (int *)((long)piVar58 + -1);
          if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_001ca1b1;
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) && (puVar38 = puVar42, piVar44 < piVar58));
LAB_001c9e1a:
        puVar42 = (ulong *)((long)puVar42 + 1);
      }
    }
    else {
      puVar45 = puVar38;
      if (puVar38 < puVar1) {
        uVar46 = *puVar38 ^ *puVar36;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar36 == *puVar38) {
          puVar45 = (ulong *)((long)puVar42 + 0xc);
          puVar36 = (ulong *)(piVar58 + 3);
          do {
            if (puVar1 <= puVar45) goto LAB_001ca116;
            uVar35 = *puVar36;
            uVar46 = *puVar45;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar45 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar38));
            puVar45 = puVar45 + 1;
            puVar36 = puVar36 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_001ca116:
        if ((puVar45 < puVar2) && ((int)*puVar36 == (int)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 4);
          puVar36 = (ulong *)((long)puVar36 + 4);
        }
        if ((puVar45 < puVar3) && ((short)*puVar36 == (short)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 2);
          puVar36 = (ulong *)((long)puVar36 + 2);
        }
        if (puVar45 < iEnd) {
          puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar45));
        }
        pBVar53 = (BYTE *)((long)puVar45 - (long)puVar38);
      }
      pBVar53 = pBVar53 + 4;
      uVar37 = (int)puVar42 - (int)piVar58;
      if ((iStart < piVar58) && (src < puVar42)) {
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          piVar58 = (int *)((long)piVar58 + -1);
          if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_001ca1b1;
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) && (puVar38 = puVar42, iStart < piVar58));
        goto LAB_001c9e1a;
      }
    }
  }
LAB_001ca1de:
  if (uVar37 == 0) {
LAB_001cd5db:
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                  ,0x1e4,
                  "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_001cd521:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x29d,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_001cd55f:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x29f,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar35 = (long)puVar42 - (long)src;
  puVar38 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar38 + uVar35)) {
LAB_001cd57e:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2a0,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (iEnd < puVar42) {
LAB_001cd59d:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2a1,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar22 < puVar42) {
    ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
  }
  else {
    uVar46 = *(ulong *)((long)src + 8);
    *puVar38 = *src;
    puVar38[1] = uVar46;
    if (0x10 < uVar35) {
      pBVar59 = seqStore->lit;
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10)))) {
LAB_001cd619:
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                      ,0xe9,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      uVar46 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar59 + 0x18) = uVar46;
      if (0x20 < (long)uVar35) {
        lVar39 = 0;
        do {
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
          uVar18 = puVar5[1];
          pBVar43 = pBVar59 + lVar39 + 0x20;
          *(undefined8 *)pBVar43 = *puVar5;
          *(undefined8 *)(pBVar43 + 8) = uVar18;
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
          uVar18 = puVar5[1];
          *(undefined8 *)(pBVar43 + 0x10) = *puVar5;
          *(undefined8 *)(pBVar43 + 0x18) = uVar18;
          lVar39 = lVar39 + 0x20;
        } while (pBVar43 + 0x20 < pBVar59 + uVar35);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar35;
  if (0xffff < uVar35) {
    if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001cd5fa:
      __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2b2,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar35;
  psVar25->offBase = uVar37 + 3;
  if (pBVar53 < (BYTE *)0x3) {
LAB_001cd540:
    __assert_fail("matchLength >= MINMATCH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,700,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  pBVar59 = pBVar53 + -3;
  local_11c = local_144;
  local_144 = uVar37;
  if ((BYTE *)0xffff < pBVar59) {
    if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001cd5bc:
      __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2bf,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
LAB_001ca330:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001ca356:
  psVar25->mlBase = (U16)pBVar59;
  seqStore->sequences = psVar25 + 1;
  puVar42 = (ulong *)((long)puVar42 + (long)pBVar53);
  src = puVar42;
  if (puVar42 <= puVar21) {
    uVar40 = UVar54 + 2;
    lVar39 = *(long *)(pBVar9 + uVar40);
    pUVar14[(ulong)(lVar39 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] = uVar40;
    pUVar14[(ulong)(*(long *)((long)puVar42 + -2) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] =
         ((int)puVar42 + -2) - iVar50;
    pUVar15[(ulong)(lVar39 * -0x30e44323405a9d00) >> (bVar29 & 0x3f)] = uVar40;
    pUVar15[(ulong)(*(long *)((long)puVar42 + -1) * -0x30e44323405a9d00) >> (bVar29 & 0x3f)] =
         ((int)puVar42 + -1) - iVar50;
    do {
      if (puVar21 < puVar42) break;
      UVar30 = (int)puVar42 - iVar50;
      uVar40 = UVar30 - local_11c;
      pBVar59 = pBVar9;
      if (uVar40 < uVar17) {
        pBVar59 = pBVar11 + -uVar56;
      }
      if (((uVar17 - 1) - uVar40 < 3) || (*(int *)(pBVar59 + uVar40) != (int)*puVar42)) {
        bVar16 = false;
        uVar40 = local_11c;
      }
      else {
        puVar38 = iEnd;
        if (uVar40 < uVar17) {
          puVar38 = mEnd;
        }
        sVar23 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar42 + 4),(BYTE *)((long)(pBVar59 + uVar40) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar38,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001cd521;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001cd55f;
        puVar38 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_001cd57e;
        if (iEnd < src) goto LAB_001cd59d;
        if (puVar22 < src) {
          ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)src,(BYTE *)puVar22);
        }
        else {
          uVar35 = *(ulong *)((long)src + 8);
          *puVar38 = *src;
          puVar38[1] = uVar35;
        }
        psVar25 = seqStore->sequences;
        psVar25->litLength = 0;
        psVar25->offBase = 1;
        if (sVar23 + 4 < 3) goto LAB_001cd540;
        if (0xffff < sVar23 + 1) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd5bc;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar25->mlBase = (U16)(sVar23 + 1);
        seqStore->sequences = psVar25 + 1;
        uVar35 = *puVar42;
        pUVar15[uVar35 * -0x30e44323405a9d00 >> (bVar29 & 0x3f)] = UVar30;
        pUVar14[uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f)] = UVar30;
        puVar42 = (ulong *)(sVar23 + 4 + (long)puVar42);
        bVar16 = true;
        src = puVar42;
        uVar40 = local_144;
        local_144 = local_11c;
      }
      local_11c = uVar40;
    } while (bVar16);
  }
LAB_001ca5bb:
  if (puVar21 <= puVar42) goto LAB_001cd4f2;
  goto LAB_001c97dc;
LAB_001ca1b1:
  puVar42 = (ulong *)((long)puVar38 + 1);
  goto LAB_001ca1de;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_7(ms, seqStore, rep, src, srcSize);
    }
}